

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack4.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_transform_output_pack4_sse
               (Mat *top_blob_tm,Mat *top_blob,Mat *bias,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  __m128 _out01;
  __m128 _out00;
  __m128 _tmp03;
  __m128 _tmp02;
  __m128 _tmp01;
  __m128 _tmp00;
  int m_3;
  __m128 _tmp1m;
  __m128 _tmp0m;
  __m128 _out0tm3;
  __m128 _out0tm2;
  __m128 _out0tm1;
  __m128 _out0tm0;
  int m_2;
  float *output0;
  float *output0_tm_3;
  float *output0_tm_2;
  float *output0_tm_1;
  float *output0_tm_0;
  int j;
  int i;
  float tmp [2] [4] [4];
  __m128 _bias0;
  Mat out0;
  Mat out0_tm;
  int p;
  float *biasptr;
  int tiles;
  int h_tiles;
  int w_tiles;
  int outch;
  int outh;
  int outw;
  Mat *m_1;
  Mat *m;
  undefined8 local_688;
  undefined8 uStack_680;
  int local_5dc;
  int local_56c;
  undefined8 *local_568;
  undefined8 *local_560;
  undefined1 (*local_558) [16];
  undefined1 (*local_550) [16];
  undefined8 *local_548;
  int local_540;
  int local_53c;
  undefined8 local_538 [20];
  void *local_498;
  int *local_490;
  ulong local_488;
  undefined4 local_480;
  long *local_478;
  int local_470;
  int local_46c;
  int local_468;
  undefined4 local_464;
  undefined4 local_460;
  ulong local_458;
  void *local_450;
  int *local_448;
  ulong local_440;
  undefined4 local_438;
  long *local_430;
  int local_428;
  int local_424;
  int local_420;
  undefined4 local_41c;
  undefined4 local_418;
  ulong local_410;
  int local_404;
  long local_400;
  int local_3f8;
  int local_3f4;
  int local_3f0;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  long *local_3d0;
  long *local_3c8;
  void **local_3c0;
  void **local_3b0;
  int local_390;
  undefined4 local_38c;
  void **local_388;
  int local_370;
  undefined4 local_36c;
  void **local_368;
  undefined1 local_35d;
  int local_35c;
  void **local_350;
  void **local_330;
  undefined1 local_31d;
  int local_31c;
  void **local_310;
  void *local_2e0;
  void *local_2d0;
  int local_2bc;
  void **local_2b8;
  undefined8 *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 *local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_230;
  undefined8 *local_228;
  undefined8 *local_220;
  undefined8 *local_218;
  undefined8 *local_210;
  undefined8 *local_208;
  undefined1 (*local_200) [16];
  undefined1 (*local_1f8) [16];
  undefined8 *local_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [16];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  long *local_90;
  undefined4 local_84;
  ulong local_80;
  void *local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  void **local_60;
  long *local_58;
  undefined4 local_4c;
  ulong local_48;
  void *local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  void **local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_3e4 = *(int *)((long)in_RSI + 0x2c);
  local_3e8 = (int)in_RSI[6];
  local_3ec = (int)in_RSI[7];
  local_3f0 = local_3e4 / 2;
  local_3f4 = local_3e8 / 2;
  local_3f8 = local_3f0 * local_3f4;
  local_400 = *in_RDX;
  local_3d0 = in_RSI;
  local_3c8 = in_RDI;
  for (local_404 = 0; local_404 < local_3ec; local_404 = local_404 + 1) {
    local_310 = &local_450;
    local_64 = *(int *)((long)local_3c8 + 0x2c);
    local_68 = (int)local_3c8[6];
    local_6c = *(undefined4 *)((long)local_3c8 + 0x34);
    local_78 = (void *)(*local_3c8 + local_3c8[8] * (long)local_404 * local_3c8[2]);
    local_80 = local_3c8[2];
    local_84 = (undefined4)local_3c8[3];
    local_90 = (long *)local_3c8[4];
    local_60 = &local_450;
    local_448 = (int *)0x0;
    local_41c = 1;
    local_8 = (long)local_64 * (long)local_68 * local_80;
    local_410 = (local_8 + 0xfU & 0xfffffffffffffff0) / local_80;
    local_428 = (int)local_3c8[5] + -1;
    if ((int)local_3c8[5] == 4) {
      local_410 = (long)*(int *)((long)local_3c8 + 0x2c) * (long)(int)local_3c8[6];
    }
    local_350 = &local_498;
    local_2c = *(int *)((long)local_3d0 + 0x2c);
    local_30 = (int)local_3d0[6];
    local_34 = *(undefined4 *)((long)local_3d0 + 0x34);
    local_40 = (void *)(*local_3d0 + local_3d0[8] * (long)local_404 * local_3d0[2]);
    local_48 = local_3d0[2];
    local_4c = (undefined4)local_3d0[3];
    local_58 = (long *)local_3d0[4];
    local_28 = &local_498;
    local_490 = (int *)0x0;
    local_464 = 1;
    local_18 = (long)local_2c * (long)local_30 * local_48;
    local_458 = (local_18 + 0xfU & 0xfffffffffffffff0) / local_48;
    local_470 = (int)local_3d0[5] + -1;
    if ((int)local_3d0[5] == 4) {
      local_458 = (long)*(int *)((long)local_3d0 + 0x2c) * (long)(int)local_3d0[6];
    }
    local_c = 0x10;
    local_1c = 0x10;
    local_31c = local_404;
    local_31d = 1;
    local_35c = local_404;
    local_35d = 1;
    if (local_400 == 0) {
      local_e8 = 0;
      uStack_e0 = 0;
      local_688 = 0;
      uStack_680 = 0;
    }
    else {
      local_2b0 = (undefined8 *)(local_400 + (long)(local_404 << 2) * 4);
      local_688 = *local_2b0;
      uStack_680 = local_2b0[1];
    }
    local_538[0x10] = local_688;
    local_538[0x11] = uStack_680;
    local_498 = local_40;
    local_488 = local_48;
    local_480 = local_4c;
    local_478 = local_58;
    local_46c = local_2c;
    local_468 = local_30;
    local_460 = local_34;
    local_450 = local_78;
    local_440 = local_80;
    local_438 = local_84;
    local_430 = local_90;
    local_424 = local_64;
    local_420 = local_68;
    local_418 = local_6c;
    for (local_53c = 0; local_53c < local_3f4; local_53c = local_53c + 1) {
      for (local_540 = 0; local_540 < local_3f0; local_540 = local_540 + 1) {
        local_330 = &local_450;
        local_548 = (undefined8 *)
                    ((long)local_450 + (long)((local_53c * local_3f0 + local_540) * 4) * 4);
        local_550 = (undefined1 (*) [16])((long)local_548 + (long)(local_3f8 << 2) * 4);
        local_558 = (undefined1 (*) [16])((long)local_548 + (long)(local_3f8 << 3) * 4);
        local_560 = (undefined8 *)((long)local_548 + (long)(local_3f8 * 0xc) * 4);
        local_2bc = local_53c << 1;
        local_2b8 = &local_498;
        local_568 = (undefined8 *)
                    ((long)local_498 +
                    (long)(local_540 << 3) * 4 + (long)local_46c * (long)local_2bc * local_488);
        for (local_56c = 0; local_56c < 4; local_56c = local_56c + 1) {
          local_1f0 = local_548;
          uVar1 = *local_548;
          uVar2 = local_548[1];
          local_1f8 = local_550;
          local_a8 = *(undefined8 *)*local_550;
          uStack_a0 = *(undefined8 *)(*local_550 + 8);
          local_200 = local_558;
          local_b8 = *(undefined8 *)*local_558;
          uStack_b0 = *(undefined8 *)(*local_558 + 8);
          local_208 = local_560;
          uVar3 = *local_560;
          uVar4 = local_560[1];
          local_f8._0_4_ = (float)uVar1;
          local_f8._4_4_ = (float)((ulong)uVar1 >> 0x20);
          uStack_f0._0_4_ = (float)uVar2;
          uStack_f0._4_4_ = (float)((ulong)uVar2 >> 0x20);
          local_108._0_4_ = (float)local_a8;
          local_108._4_4_ = (float)((ulong)local_a8 >> 0x20);
          uStack_100._0_4_ = (float)uStack_a0;
          uStack_100._4_4_ = (float)((ulong)uStack_a0 >> 0x20);
          local_118 = (float)local_f8 + (float)local_108;
          fStack_114 = local_f8._4_4_ + local_108._4_4_;
          fStack_110 = (float)uStack_f0 + (float)uStack_100;
          fStack_10c = uStack_f0._4_4_ + uStack_100._4_4_;
          local_128._0_4_ = (float)local_b8;
          local_128._4_4_ = (float)((ulong)local_b8 >> 0x20);
          uStack_120._0_4_ = (float)uStack_b0;
          uStack_120._4_4_ = (float)((ulong)uStack_b0 >> 0x20);
          _local_138 = vsubps_avx(*local_550,*local_558);
          local_148._0_4_ = (float)uVar3;
          local_148._4_4_ = (float)((ulong)uVar3 >> 0x20);
          uStack_140._0_4_ = (float)uVar4;
          uStack_140._4_4_ = (float)((ulong)uVar4 >> 0x20);
          fVar8 = (float)local_138._0_4_ + (float)local_148;
          fVar9 = (float)local_138._4_4_ + local_148._4_4_;
          fVar10 = fStack_130 + (float)uStack_140;
          fVar11 = fStack_12c + uStack_140._4_4_;
          local_230 = local_538 + (long)local_56c * 2;
          local_248 = CONCAT44(fStack_114 + local_128._4_4_,local_118 + (float)local_128);
          uVar5 = CONCAT44(fStack_10c + uStack_120._4_4_,fStack_110 + (float)uStack_120);
          uStack_240 = uVar5;
          local_148 = uVar3;
          uStack_140 = uVar4;
          local_128 = local_b8;
          uStack_120 = uStack_b0;
          local_108 = local_a8;
          uStack_100 = uStack_a0;
          local_f8 = uVar1;
          uStack_f0 = uVar2;
          *local_230 = local_248;
          local_538[(long)local_56c * 2 + 1] = uVar5;
          local_250 = local_538 + (long)local_56c * 2 + 8;
          local_268 = CONCAT44(fVar9,fVar8);
          uVar1 = CONCAT44(fVar11,fVar10);
          uStack_260 = uVar1;
          *local_250 = local_268;
          local_538[(long)local_56c * 2 + 9] = uVar1;
          local_548 = (undefined8 *)((long)local_548 + (long)(local_3f8 << 4) * 4);
          local_550 = (undefined1 (*) [16])(*local_550 + (long)(local_3f8 << 4) * 4);
          local_558 = (undefined1 (*) [16])(*local_558 + (long)(local_3f8 << 4) * 4);
          local_560 = (undefined8 *)((long)local_560 + (long)(local_3f8 << 4) * 4);
        }
        for (local_5dc = 0; local_5dc < 2; local_5dc = local_5dc + 1) {
          local_210 = local_538 + (long)local_5dc * 8;
          uVar1 = *local_210;
          uVar2 = local_538[(long)local_5dc * 8 + 1];
          local_218 = local_538 + (long)local_5dc * 8 + 2;
          local_c8 = *local_218;
          uStack_c0 = local_538[(long)local_5dc * 8 + 3];
          local_220 = local_538 + (long)local_5dc * 8 + 4;
          local_d8 = *local_220;
          uStack_d0 = local_538[(long)local_5dc * 8 + 5];
          local_228 = local_538 + (long)local_5dc * 8 + 6;
          uVar3 = *local_228;
          uVar4 = local_538[(long)local_5dc * 8 + 7];
          local_158._0_4_ = (float)uVar1;
          local_158._4_4_ = (float)((ulong)uVar1 >> 0x20);
          uStack_150._0_4_ = (float)uVar2;
          uStack_150._4_4_ = (float)((ulong)uVar2 >> 0x20);
          local_168._0_4_ = (float)local_c8;
          local_168._4_4_ = (float)((ulong)local_c8 >> 0x20);
          uStack_160._0_4_ = (float)uStack_c0;
          uStack_160._4_4_ = (float)((ulong)uStack_c0 >> 0x20);
          local_178 = (float)local_158 + (float)local_168;
          fStack_174 = local_158._4_4_ + local_168._4_4_;
          fStack_170 = (float)uStack_150 + (float)uStack_160;
          fStack_16c = uStack_150._4_4_ + uStack_160._4_4_;
          local_188._0_4_ = (float)local_d8;
          local_188._4_4_ = (float)((ulong)local_d8 >> 0x20);
          uStack_180._0_4_ = (float)uStack_d0;
          uStack_180._4_4_ = (float)((ulong)uStack_d0 >> 0x20);
          local_1a8 = local_178 + (float)local_188;
          fStack_1a4 = fStack_174 + local_188._4_4_;
          fStack_1a0 = fStack_170 + (float)uStack_180;
          fStack_19c = fStack_16c + uStack_180._4_4_;
          local_198._0_4_ = (float)local_538[0x10];
          local_198._4_4_ = (float)((ulong)local_538[0x10] >> 0x20);
          uStack_190._0_4_ = (float)local_538[0x11];
          uStack_190._4_4_ = (float)((ulong)local_538[0x11] >> 0x20);
          local_1d8._8_8_ = local_538[0x11];
          local_1d8._0_8_ = local_538[0x10];
          auVar7._8_8_ = uStack_c0;
          auVar7._0_8_ = local_c8;
          auVar6._8_8_ = uStack_d0;
          auVar6._0_8_ = local_d8;
          _local_1b8 = vsubps_avx(auVar7,auVar6);
          local_1c8._0_4_ = (float)uVar3;
          local_1c8._4_4_ = (float)((ulong)uVar3 >> 0x20);
          uStack_1c0._0_4_ = (float)uVar4;
          uStack_1c0._4_4_ = (float)((ulong)uVar4 >> 0x20);
          local_1e8 = (float)local_1b8._0_4_ + (float)local_1c8;
          fStack_1e4 = (float)local_1b8._4_4_ + local_1c8._4_4_;
          fStack_1e0 = fStack_1b0 + (float)uStack_1c0;
          fStack_1dc = fStack_1ac + uStack_1c0._4_4_;
          local_270 = local_568;
          local_288 = CONCAT44(local_198._4_4_ + fStack_1a4,(float)local_198 + local_1a8);
          uStack_280 = CONCAT44(uStack_190._4_4_ + fStack_19c,(float)uStack_190 + fStack_1a0);
          *local_568 = local_288;
          local_568[1] = uStack_280;
          local_290 = local_568 + 2;
          local_2a8 = CONCAT44(local_198._4_4_ + fStack_1e4,(float)local_198 + local_1e8);
          uStack_2a0 = CONCAT44(uStack_190._4_4_ + fStack_1dc,(float)uStack_190 + fStack_1e0);
          *local_290 = local_2a8;
          local_568[3] = uStack_2a0;
          local_568 = (undefined8 *)((long)local_568 + (long)(local_3e4 << 2) * 4);
          local_1c8 = uVar3;
          uStack_1c0 = uVar4;
          local_198 = local_538[0x10];
          uStack_190 = local_538[0x11];
          local_188 = local_d8;
          uStack_180 = uStack_d0;
          local_168 = local_c8;
          uStack_160 = uStack_c0;
          local_158 = uVar1;
          uStack_150 = uVar2;
        }
      }
    }
    local_3c0 = &local_498;
    local_368 = local_3c0;
    if (local_490 != (int *)0x0) {
      local_36c = 0xffffffff;
      LOCK();
      local_370 = *local_490;
      *local_490 = *local_490 + -1;
      UNLOCK();
      if (local_370 == 1) {
        if (local_478 == (long *)0x0) {
          local_2e0 = local_498;
          if (local_498 != (void *)0x0) {
            free(local_498);
          }
        }
        else {
          (**(code **)(*local_478 + 0x18))(local_478,local_498);
        }
      }
    }
    local_498 = (void *)0x0;
    local_488 = 0;
    local_480 = 0;
    local_470 = 0;
    local_46c = 0;
    local_468 = 0;
    local_464 = 0;
    local_460 = 0;
    local_458 = 0;
    local_490 = (int *)0x0;
    local_3b0 = &local_450;
    local_388 = local_3b0;
    if (local_448 != (int *)0x0) {
      local_38c = 0xffffffff;
      LOCK();
      local_390 = *local_448;
      *local_448 = *local_448 + -1;
      UNLOCK();
      if (local_390 == 1) {
        if (local_430 == (long *)0x0) {
          local_2d0 = local_450;
          if (local_450 != (void *)0x0) {
            free(local_450);
          }
        }
        else {
          (**(code **)(*local_430 + 0x18))(local_430,local_450);
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_output_pack4_sse(const Mat& top_blob_tm, Mat& top_blob, const Mat& bias, const Option& opt)
{
    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int w_tiles = outw / 2;
    const int h_tiles = outh / 2;
    const int tiles = w_tiles * h_tiles;

    const float* biasptr = bias;

    // const float otm[2][4] = {
    //     {1.0f,  1.0f,  1.0f,  0.0f},
    //     {0.0f,  1.0f, -1.0f,  1.0f}
    // };

    // 0 = r00 + r01 + r02
    // 1 = r01 - r02 + r03

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        const Mat out0_tm = top_blob_tm.channel(p);
        Mat out0 = top_blob.channel(p);

        __m128 _bias0 = biasptr ? _mm_loadu_ps(biasptr + p * 4) : _mm_setzero_ps();

#ifdef _MSC_VER
        __declspec(align(16))
#else
        __attribute__((aligned(16)))
#endif
        float tmp[2][4][4];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* output0_tm_0 = (const float*)out0_tm + (i * w_tiles + j) * 4;
                const float* output0_tm_1 = output0_tm_0 + tiles * 4;
                const float* output0_tm_2 = output0_tm_0 + tiles * 4 * 2;
                const float* output0_tm_3 = output0_tm_0 + tiles * 4 * 3;

                float* output0 = out0.row(i * 2) + (j * 2) * 4;

                for (int m = 0; m < 4; m++)
                {
                    __m128 _out0tm0 = _mm_load_ps(output0_tm_0);
                    __m128 _out0tm1 = _mm_load_ps(output0_tm_1);
                    __m128 _out0tm2 = _mm_load_ps(output0_tm_2);
                    __m128 _out0tm3 = _mm_load_ps(output0_tm_3);

                    __m128 _tmp0m = _mm_add_ps(_mm_add_ps(_out0tm0, _out0tm1), _out0tm2);
                    __m128 _tmp1m = _mm_add_ps(_mm_sub_ps(_out0tm1, _out0tm2), _out0tm3);

                    _mm_store_ps(tmp[0][m], _tmp0m);
                    _mm_store_ps(tmp[1][m], _tmp1m);

                    output0_tm_0 += tiles * 4 * 4;
                    output0_tm_1 += tiles * 4 * 4;
                    output0_tm_2 += tiles * 4 * 4;
                    output0_tm_3 += tiles * 4 * 4;
                }

                for (int m = 0; m < 2; m++)
                {
                    __m128 _tmp00 = _mm_load_ps(tmp[m][0]);
                    __m128 _tmp01 = _mm_load_ps(tmp[m][1]);
                    __m128 _tmp02 = _mm_load_ps(tmp[m][2]);
                    __m128 _tmp03 = _mm_load_ps(tmp[m][3]);

                    __m128 _out00 = _mm_add_ps(_bias0, _mm_add_ps(_mm_add_ps(_tmp00, _tmp01), _tmp02));
                    __m128 _out01 = _mm_add_ps(_bias0, _mm_add_ps(_mm_sub_ps(_tmp01, _tmp02), _tmp03));

                    _mm_store_ps(output0, _out00);
                    _mm_store_ps(output0 + 4, _out01);

                    output0 += outw * 4;
                }
            }
        }
    }
}